

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_finding_on_map.hpp
# Opt level: O2

void __thiscall graph_tests::PathFindingOnMap::~PathFindingOnMap(PathFindingOnMap *this)

{
  (this->super_TestWithParam<graph_tests::PathFindingOnMapCase>).super_Test._vptr_Test =
       (_func_int **)&PTR__PathFindingOnMap_00169008;
  (this->super_TestWithParam<graph_tests::PathFindingOnMapCase>).
  super_WithParamInterface<graph_tests::PathFindingOnMapCase>._vptr_WithParamInterface =
       (_func_int **)&PTR__PathFindingOnMap_00169048;
  graph_impl::
  Graph<graph_tests::PointOnMap,_graph_meta::list<>,_graph_meta::list<>,_graph_meta::list<>,_graph_meta::list<>_>
  ::~Graph(&this->graph_);
  std::__cxx11::string::~string((string *)&this->answer_);
  testing::Test::~Test((Test *)this);
  return;
}

Assistant:

void SetUp() override {
    size_t start_cnt = 0;
    size_t finish_cnt = 0;
    const std::vector<std::string>& map = GetMap();
    for (size_t i = 0; i < map.size(); i++) {
      if (i != 0) {
        ASSERT_EQ(map[i].size(), map[i - 1].size());
      }
      for (size_t j = 0; j < map[i].size(); j++) {
        ASSERT_TRUE(IsValidType(map[i][j]));
        if (map[i][j] == 'S')
          start_cnt++;
        if (map[i][j] == 'F')
          finish_cnt++;
        if (map[i][j] == '#')
          continue;
        const PointOnMap u = {i, j, map[i][j]};
        graph_.AddNode(u);
        for (PointOnMap neighbor : GetNeighbors(u))
          graph_.AddEdge({u, std::move(neighbor)});
      }
    }
    ASSERT_EQ(start_cnt, 1);
    ASSERT_EQ(finish_cnt, 1);
  }